

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3OptimizeFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  Fts3Table *p;
  int iVar1;
  int iVar2;
  char *z;
  Fts3Cursor *pCursor;
  Fts3Cursor *local_20;
  
  iVar1 = fts3FunctionArg(pContext,"optimize",*apVal,&local_20);
  if (iVar1 != 0) {
    return;
  }
  p = (Fts3Table *)(local_20->base).pVtab;
  iVar1 = sqlite3_exec(p->db,"SAVEPOINT fts3",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
  if (iVar1 == 0) {
    iVar1 = fts3DoOptimize(p,1);
    if ((iVar1 == 0x65) || (iVar1 == 0)) {
      iVar2 = sqlite3_exec(p->db,"RELEASE fts3",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
      if (iVar2 != 0) {
        iVar1 = iVar2;
      }
    }
    else {
      sqlite3_exec(p->db,"ROLLBACK TO fts3",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
      sqlite3_exec(p->db,"RELEASE fts3",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
    }
  }
  sqlite3_blob_close(p->pSegments);
  p->pSegments = (sqlite3_blob *)0x0;
  if (iVar1 == 0x65) {
    z = "Index already optimal";
  }
  else {
    if (iVar1 != 0) {
      sqlite3_result_error_code(pContext,iVar1);
      return;
    }
    z = "Index optimized";
  }
  setResultStrOrError(pContext,z,-1,'\x01',(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

static void fts3OptimizeFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  int rc;                         /* Return code */
  Fts3Table *p;                   /* Virtual table handle */
  Fts3Cursor *pCursor;            /* Cursor handle passed through apVal[0] */

  UNUSED_PARAMETER(nVal);

  assert( nVal==1 );
  if( fts3FunctionArg(pContext, "optimize", apVal[0], &pCursor) ) return;
  p = (Fts3Table *)pCursor->base.pVtab;
  assert( p );

  rc = sqlite3Fts3Optimize(p);

  switch( rc ){
    case SQLITE_OK:
      sqlite3_result_text(pContext, "Index optimized", -1, SQLITE_STATIC);
      break;
    case SQLITE_DONE:
      sqlite3_result_text(pContext, "Index already optimal", -1, SQLITE_STATIC);
      break;
    default:
      sqlite3_result_error_code(pContext, rc);
      break;
  }
}